

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

int Cec_ManResimulateCounterExamples(Cec_ManSim_t *pSim,Vec_Int_t *vCexStore,int nFrames)

{
  Cec_ParSim_t *pCVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vPairs;
  void **ppvVar4;
  Vec_Ptr_t *vInfo;
  ulong uVar5;
  void **ppvVar6;
  void **ppvVar7;
  long lVar8;
  uint uVar9;
  int iStart;
  
  vPairs = Gia_ManCorrCreateRemapping(pSim->pAig);
  Gia_ManCreateValueRefs(pSim->pAig);
  pCVar1 = pSim->pPars;
  pCVar1->nFrames = nFrames;
  iVar3 = pSim->pAig->nRegs;
  uVar9 = (pSim->pAig->vCis->nSize - iVar3) * nFrames + iVar3;
  lVar8 = (long)pCVar1->nWords;
  ppvVar4 = (void **)malloc((lVar8 * 4 + 8) * (long)(int)uVar9);
  if (0 < (int)uVar9) {
    ppvVar7 = ppvVar4 + (int)uVar9;
    uVar5 = (ulong)uVar9;
    ppvVar6 = ppvVar4;
    do {
      *ppvVar6 = ppvVar7;
      ppvVar6 = ppvVar6 + 1;
      ppvVar7 = (void **)((long)ppvVar7 + lVar8 * 4);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  vInfo = (Vec_Ptr_t *)malloc(0x10);
  vInfo->nSize = uVar9;
  vInfo->nCap = uVar9;
  vInfo->pArray = ppvVar4;
  iVar3 = vCexStore->nSize;
  if (iVar3 < 1) {
    uVar9 = 0;
    iStart = 0;
  }
  else {
    iStart = 0;
    uVar9 = 0;
    do {
      Cec_ManStartSimInfo(vInfo,pSim->pAig->nRegs);
      iStart = Cec_ManLoadCounterExamples(vInfo,vCexStore,iStart);
      Gia_ManCorrPerformRemapping(vPairs,vInfo);
      uVar2 = Cec_ManSeqResimulate(pSim,vInfo);
      uVar9 = uVar9 | uVar2;
      iVar3 = vCexStore->nSize;
    } while (iStart < iVar3);
  }
  if (iStart != iVar3) {
    __assert_fail("iStart == Vec_IntSize(vCexStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0x236,"int Cec_ManResimulateCounterExamples(Cec_ManSim_t *, Vec_Int_t *, int)");
  }
  if (vInfo->pArray != (void **)0x0) {
    free(vInfo->pArray);
    vInfo->pArray = (void **)0x0;
  }
  free(vInfo);
  if (vPairs->pArray != (int *)0x0) {
    free(vPairs->pArray);
    vPairs->pArray = (int *)0x0;
  }
  if (vPairs != (Vec_Int_t *)0x0) {
    free(vPairs);
  }
  return uVar9;
}

Assistant:

int Cec_ManResimulateCounterExamples( Cec_ManSim_t * pSim, Vec_Int_t * vCexStore, int nFrames )
{ 
    Vec_Int_t * vPairs;
    Vec_Ptr_t * vSimInfo; 
    int RetValue = 0, iStart = 0;
    vPairs = Gia_ManCorrCreateRemapping( pSim->pAig );
    Gia_ManCreateValueRefs( pSim->pAig );
//    pSim->pPars->nWords  = 63;
    pSim->pPars->nFrames = nFrames;
    vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pSim->pAig) + Gia_ManPiNum(pSim->pAig) * nFrames, pSim->pPars->nWords );
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        Cec_ManStartSimInfo( vSimInfo, Gia_ManRegNum(pSim->pAig) );
        iStart = Cec_ManLoadCounterExamples( vSimInfo, vCexStore, iStart );
//        iStart = Cec_ManLoadCounterExamples2( vSimInfo, vCexStore, iStart );
//        Gia_ManCorrRemapSimInfo( pSim->pAig, vSimInfo );
        Gia_ManCorrPerformRemapping( vPairs, vSimInfo );
        RetValue |= Cec_ManSeqResimulate( pSim, vSimInfo );
//        Cec_ManSeqResimulateInfo( pSim->pAig, vSimInfo, NULL );
    }
//Gia_ManEquivPrintOne( pSim->pAig, 85, 0 );
    assert( iStart == Vec_IntSize(vCexStore) );
    Vec_PtrFree( vSimInfo );
    Vec_IntFree( vPairs );
    return RetValue;
}